

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_png.cpp
# Opt level: O1

bool M_CreateDummyPNG(FileWriter *file)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*file->_vptr_FileWriter[2])(file,M_CreateDummyPNG::dummyPNG,0x37);
  return CONCAT44(extraout_var,iVar1) == 0x37;
}

Assistant:

bool M_CreateDummyPNG (FileWriter *file)
{
	static const BYTE dummyPNG[] =
	{
		137,'P','N','G',13,10,26,10,
		0,0,0,13,'I','H','D','R',
		0,0,0,1,0,0,0,1,8,0,0,0,0,0x3a,0x7e,0x9b,0x55,
		0,0,0,10,'I','D','A','T',
		104,222,99,96,0,0,0,2,0,1,0x9f,0x65,0x0e,0x18
	};
	return file->Write (dummyPNG, sizeof(dummyPNG)) == sizeof(dummyPNG);
}